

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfFast.c
# Opt level: O2

int Cnf_CountCnfSize(Aig_Man_t *p)

{
  int iVar1;
  Vec_Ptr_t *p_00;
  Aig_Man_t *pAVar2;
  Vec_Int_t *p_01;
  void *pvVar3;
  Aig_Obj_t *pRoot;
  Aig_Obj_t *pAVar4;
  uint uVar5;
  Vec_Ptr_t *p_02;
  Aig_Man_t *p_03;
  int iVar6;
  uint local_44;
  
  pAVar2 = p;
  p_00 = Vec_PtrAlloc((int)p);
  pAVar2 = (Aig_Man_t *)Vec_PtrAlloc((int)pAVar2);
  p_01 = Vec_IntAlloc(0x10000);
  uVar5 = 0;
  iVar6 = 0;
  while( true ) {
    p_02 = p->vObjs;
    iVar1 = p_02->nSize;
    if (iVar1 <= iVar6) break;
    pvVar3 = Vec_PtrEntry(p_02,iVar6);
    if (pvVar3 != (void *)0x0) {
      uVar5 = uVar5 + ((*(uint *)((long)pvVar3 + 0x18) >> 4 & 1) != 0);
    }
    iVar6 = iVar6 + 1;
  }
  local_44 = 0;
  iVar6 = 0;
  do {
    if (iVar1 <= iVar6) {
      printf("Vars = %d  Clauses = %d\n",(ulong)uVar5,(ulong)local_44);
      Vec_PtrFree(p_00);
      Vec_PtrFree((Vec_Ptr_t *)pAVar2);
      Vec_IntFree(p_01);
      return local_44;
    }
    pRoot = (Aig_Obj_t *)Vec_PtrEntry(p_02,iVar6);
    if (((pRoot != (Aig_Obj_t *)0x0) && ((*(ulong *)&pRoot->field_0x18 & 0x10) != 0)) &&
       (0xfffffffd < ((uint)*(ulong *)&pRoot->field_0x18 & 7) - 7)) {
      Cnf_CollectLeaves(pRoot,p_00,0);
      Cnf_CollectVolume(p,pRoot,p_00,(Vec_Ptr_t *)pAVar2);
      p_03 = pAVar2;
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntryLast((Vec_Ptr_t *)pAVar2);
      if (pRoot != pAVar4) {
        __assert_fail("pObj == Vec_PtrEntryLast(vNodes)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/cnf/cnfFast.c"
                      ,0x205,"int Cnf_CountCnfSize(Aig_Man_t *)");
      }
      iVar1 = Cnf_CutCountClauses(p_03,p_00,(Vec_Ptr_t *)pAVar2,p_01);
      local_44 = local_44 + iVar1;
    }
    iVar6 = iVar6 + 1;
    p_02 = p->vObjs;
    iVar1 = p_02->nSize;
  } while( true );
}

Assistant:

int Cnf_CountCnfSize( Aig_Man_t * p )
{
    Vec_Ptr_t * vLeaves, * vNodes;
    Vec_Int_t * vCover;
    Aig_Obj_t * pObj;
    int nVars = 0, nClauses = 0;
    int i, nSize;

    vLeaves = Vec_PtrAlloc( 100 );
    vNodes  = Vec_PtrAlloc( 100 );
    vCover  = Vec_IntAlloc( 1 << 16 );

    Aig_ManForEachObj( p, pObj, i )
        nVars += pObj->fMarkA;

    Aig_ManForEachNode( p, pObj, i )
    {
        if ( !pObj->fMarkA )
            continue;
        Cnf_CollectLeaves( pObj, vLeaves, 0 );
        Cnf_CollectVolume( p, pObj, vLeaves, vNodes );
        assert( pObj == Vec_PtrEntryLast(vNodes) );

        nSize = Cnf_CutCountClauses( p, vLeaves, vNodes, vCover );
//        printf( "%d(%d) ", Vec_PtrSize(vLeaves), nSize );

        nClauses += nSize;
    }
//    printf( "\n" );
    printf( "Vars = %d  Clauses = %d\n", nVars, nClauses );

    Vec_PtrFree( vLeaves );
    Vec_PtrFree( vNodes );
    Vec_IntFree( vCover );
    return nClauses;
}